

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O3

faup_snapshot_value_count_t * faup_snapshot_value_count_new(void)

{
  faup_snapshot_value_count_t *pfVar1;
  
  pfVar1 = (faup_snapshot_value_count_t *)calloc(1,0x20);
  if (pfVar1 == (faup_snapshot_value_count_t *)0x0) {
    faup_snapshot_value_count_new_cold_1();
  }
  return pfVar1;
}

Assistant:

faup_snapshot_value_count_t *faup_snapshot_value_count_new(void)
{
  faup_snapshot_value_count_t *vc;

  vc = malloc(sizeof(faup_snapshot_value_count_t));
  if (!vc) {
    fprintf(stderr, "Error: cannot allocate faup_snapshot_value_count_t\n");
    return NULL;
  }
  vc->value = NULL;
  vc->first_time_seen = 0;
  vc->last_time_seen = 0;
  vc->count = 0;

  return vc;
}